

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O2

ASDCP * __thiscall
ASDCP::MD_to_CryptoInfo(ASDCP *this,CryptographicContext *InfoObj,WriterInfo *Info,Dictionary *Dict)

{
  undefined8 uVar1;
  bool bVar2;
  MDDEntry *pMVar3;
  ILogSink *this_00;
  bool bVar4;
  undefined1 *puVar5;
  UL local_70;
  UL local_50;
  
  if (InfoObj == (CryptographicContext *)0x0) {
    puVar5 = Kumu::RESULT_PTR;
  }
  else {
    bVar4 = true;
    Info->EncryptedEssence = true;
    uVar1 = *(undefined8 *)((InfoObj->ContextID).super_Identifier<16U>.m_Value + 8);
    *(undefined8 *)Info->ContextID =
         *(undefined8 *)(InfoObj->ContextID).super_Identifier<16U>.m_Value;
    *(undefined8 *)(Info->ContextID + 8) = uVar1;
    uVar1 = *(undefined8 *)((InfoObj->CryptographicKeyID).super_Identifier<16U>.m_Value + 8);
    *(undefined8 *)Info->CryptographicKeyID =
         *(undefined8 *)(InfoObj->CryptographicKeyID).super_Identifier<16U>.m_Value;
    *(undefined8 *)(Info->CryptographicKeyID + 8) = uVar1;
    pMVar3 = Dictionary::Type(Dict,MDD_MICAlgorithm_HMAC_SHA1);
    local_50.super_Identifier<16U>.m_HasValue = true;
    local_50.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar3->ul;
    local_50.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar3->ul + 8);
    local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_002112c8;
    pMVar3 = Dictionary::Type(Dict,MDD_MICAlgorithm_NONE);
    local_70.super_Identifier<16U>.m_HasValue = true;
    local_70.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar3->ul;
    local_70.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar3->ul + 8);
    local_70.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_002112c8;
    bVar2 = UL::operator==(&InfoObj->MICAlgorithm,&local_50);
    if (!bVar2) {
      bVar2 = UL::operator==(&InfoObj->MICAlgorithm,&local_70);
      if (!bVar2) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Unexpected MICAlgorithm UL.\n");
        puVar5 = RESULT_FORMAT;
        goto LAB_001bb270;
      }
      bVar4 = false;
    }
    Info->UsesHMAC = bVar4;
    puVar5 = Kumu::RESULT_OK;
  }
LAB_001bb270:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

Result_t
ASDCP::MD_to_CryptoInfo(CryptographicContext* InfoObj, WriterInfo& Info, const Dictionary& Dict)
{
  ASDCP_TEST_NULL(InfoObj);

  Info.EncryptedEssence = true;
  memcpy(Info.ContextID, InfoObj->ContextID.Value(), UUIDlen);
  memcpy(Info.CryptographicKeyID, InfoObj->CryptographicKeyID.Value(), UUIDlen);

  UL MIC_SHA1(Dict.ul(MDD_MICAlgorithm_HMAC_SHA1));
  UL MIC_NONE(Dict.ul(MDD_MICAlgorithm_NONE));

  if ( InfoObj->MICAlgorithm == MIC_SHA1 )
    Info.UsesHMAC = true;

  else if ( InfoObj->MICAlgorithm == MIC_NONE )
    Info.UsesHMAC = false;

  else
    {
      DefaultLogSink().Error("Unexpected MICAlgorithm UL.\n");
      return RESULT_FORMAT;
    }

  return RESULT_OK;
}